

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::DiffuseAreaLight,pbrt::Transform_const&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::ShapeHandle_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,DiffuseAreaLight *p,Transform *args,
          MediumHandle *args_1,SpectrumHandle *args_2,float *args_3,ShapeHandle *args_4,
          Image *args_5,RGBColorSpace **args_6,bool *args_7,polymorphic_allocator<std::byte> *args_8
          )

{
  Float scale;
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  local_168;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_160;
  MediumInterface local_158;
  Image local_148;
  
  local_158.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_160.bits =
       (args_2->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  scale = *args_3;
  local_168.bits =
       (args_4->
       super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
       ).bits;
  local_158.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_158.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::Image::Image(&local_148,args_5);
  pbrt::DiffuseAreaLight::DiffuseAreaLight
            (p,args,&local_158,(SpectrumHandle *)&local_160,scale,(ShapeHandle *)&local_168,
             &local_148,*args_6,*args_7,args_8->memoryResource);
  pbrt::Image::~Image(&local_148);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }